

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterClass.h
# Opt level: O0

void __thiscall CharacterClass::CharacterClass(CharacterClass *this)

{
  allocator local_11;
  CharacterClass *local_10;
  CharacterClass *this_local;
  
  local_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_skill_map);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_name,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return;
}

Assistant:

CharacterClass() : m_name("") { }